

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

int map_get(pMap map,size_t key,void *value)

{
  int local_2c;
  int i;
  void *value_local;
  size_t key_local;
  pMap map_local;
  
  local_2c = 0;
  while( true ) {
    if (map->count <= (ulong)(long)local_2c) {
      return -1;
    }
    if (map->keys[local_2c] == key) break;
    local_2c = local_2c + 1;
  }
  memcpy(value,(void *)((long)map->values + (long)local_2c * map->value_size),map->value_size);
  return 0;
}

Assistant:

int map_get(pMap map, size_t key, void *value)
{
    for (int i = 0; i < map->count; i++)
    {
        if (map->keys[i] == key)
        {
            memcpy(value, map->values + i * map->value_size, map->value_size);
            return MAP_SUCCESS;
        }
    }
    return MAP_FAILED;
}